

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O3

bool read_jpeg_image(QImage *outImage,QSize scaledSize,QRect scaledClipRect,QRect clipRect,
                    int quality,Rgb888ToRgb32Converter converter,j_decompress_ptr info,
                    my_error_mgr *err,bool invertCMYK)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QRect QVar3;
  QRect QVar4;
  QRect QVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  Representation RVar8;
  Representation RVar9;
  char cVar10;
  byte bVar11;
  int iVar12;
  Representation RVar13;
  uint uVar15;
  uint uVar14;
  JSAMPARRAY ppJVar16;
  long lVar17;
  quint32 *pqVar18;
  void *__dest;
  Representation RVar19;
  uint uVar20;
  uint uVar21;
  Format FVar22;
  ulong uVar23;
  Representation RVar24;
  uint uVar25;
  AspectRatioMode AVar26;
  QSize QVar27;
  Representation RVar28;
  JSAMPROW pJVar29;
  long in_FS_OFFSET;
  double dVar30;
  undefined1 auVar31 [16];
  Representation RVar32;
  Representation RVar33;
  double dVar34;
  QRect QVar35;
  QRect QVar36;
  uchar *row;
  QRect local_c0;
  undefined8 local_b0;
  QRect local_a8;
  QRect local_98;
  QRect local_88;
  QRect local_70;
  QSize local_60;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_88._8_8_ = clipRect._8_8_;
  local_88._0_8_ = clipRect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.x1 = scaledClipRect.x1.m_i;
  RVar33.m_i = local_70.x1.m_i;
  local_70.y1 = scaledClipRect.y1.m_i;
  RVar32.m_i = local_70.y1.m_i;
  local_70.x2 = scaledClipRect.x2.m_i;
  RVar8.m_i = local_70.x2.m_i;
  local_70.y2 = scaledClipRect.y2.m_i;
  RVar9.m_i = local_70.y2.m_i;
  local_60 = scaledSize;
  iVar12 = _setjmp((__jmp_buf_tag *)err->setjmp_buffer);
  QVar35.x2.m_i = local_88.x2.m_i;
  QVar35.y2.m_i = local_88.y2.m_i;
  QVar35.x1.m_i = local_88.x1.m_i;
  QVar35.y1.m_i = local_88.y1.m_i;
  QVar5.x2.m_i = local_88.x2.m_i;
  QVar5.y2.m_i = local_88.y2.m_i;
  QVar5.x1.m_i = local_88.x1.m_i;
  QVar5.y1.m_i = local_88.y1.m_i;
  QVar4.x2.m_i = local_88.x2.m_i;
  QVar4.y2.m_i = local_88.y2.m_i;
  QVar4.x1.m_i = local_88.x1.m_i;
  QVar4.y1.m_i = local_88.y1.m_i;
  QVar3.x2.m_i = local_88.x2.m_i;
  QVar3.y2.m_i = local_88.y2.m_i;
  QVar3.x1.m_i = local_88.x1.m_i;
  QVar3.y1.m_i = local_88.y1.m_i;
  if (iVar12 == 0) {
    uVar23 = (ulong)scaledSize >> 0x20;
    RVar28 = scaledSize.wd.m_i;
    RVar24 = scaledSize.ht.m_i;
    uVar15 = 0x4b;
    if (-1 < quality) {
      uVar15 = quality;
    }
    if (RVar32.m_i <= RVar9.m_i && RVar33.m_i <= RVar8.m_i) {
      RVar19 = clipRect.x1.m_i;
      RVar13 = clipRect.y1.m_i;
      if (RVar24.m_i < 1 || RVar28.m_i < 1) {
        if (clipRect.y2.m_i.m_i < RVar13.m_i || clipRect.x2.m_i.m_i < RVar19.m_i) {
          QVar35.y1.m_i = local_70.y1.m_i;
          QVar35.x1.m_i = local_70.x1.m_i;
          QVar35.y2.m_i = local_70.y2.m_i;
          QVar35.x2.m_i = local_70.x2.m_i;
        }
        else {
          local_70.x1.m_i = RVar33.m_i + RVar19.m_i;
          local_70.y1.m_i = RVar32.m_i + RVar13.m_i;
          local_70.x2.m_i = RVar8.m_i + RVar19.m_i;
          local_70.y2.m_i = RVar9.m_i + RVar13.m_i;
          QVar35 = (QRect)QRect::operator&(&local_70,&local_88);
        }
      }
      else {
        QVar35 = QVar3;
        if (((RVar13.m_i <= clipRect.y2.m_i.m_i && RVar19.m_i <= clipRect.x2.m_i.m_i) ||
            (uVar14 = info->image_width, QVar35 = QVar4,
            (int)((ulong)uVar14 % ((ulong)scaledSize & 0xffffffff)) != 0)) ||
           (uVar20 = info->image_height, QVar35 = QVar5, (int)((ulong)uVar20 % uVar23) != 0))
        goto LAB_001064c0;
        local_88.x1.m_i = (int)((ulong)(uVar14 * RVar33.m_i) / ((ulong)scaledSize & 0xffffffff));
        QVar35.x2.m_i =
             (int)((ulong)(uVar14 * (RVar8.m_i + 1)) / ((ulong)scaledSize & 0xffffffff)) + -1;
        QVar35.y2.m_i = (int)((uVar20 * (RVar9.m_i + 1)) / uVar23) + -1;
        QVar35.x1.m_i = local_88.x1.m_i;
        QVar35.y1.m_i = (int)((uVar20 * RVar32.m_i) / uVar23);
        RVar28.m_i = (RVar8.m_i + 1) - RVar33.m_i;
        RVar24.m_i = (RVar9.m_i + 1) - RVar32.m_i;
        local_60.ht.m_i = RVar24.m_i;
        local_60.wd.m_i = RVar28.m_i;
      }
      local_70.x1.m_i = 0;
      local_70.y1.m_i = 0;
      local_70.x2.m_i = -1;
      local_70.y2.m_i = -1;
    }
LAB_001064c0:
    if (((0 < RVar28.m_i) && (0 < RVar24.m_i)) &&
       ((info->image_width != 0 && (info->image_height != 0)))) {
      local_88.x1 = QVar35.x1.m_i;
      local_88.y1 = QVar35.y1.m_i;
      local_88.x2 = QVar35.x2.m_i;
      local_88.y2 = QVar35.y2.m_i;
      if (local_88.y2.m_i < local_88.y1.m_i || local_88.x2.m_i < local_88.x1.m_i) {
        dVar30 = (double)info->image_width / (double)RVar28.m_i;
        dVar34 = (double)info->image_height / (double)RVar24.m_i;
        if (dVar34 <= dVar30) {
          dVar30 = dVar34;
        }
        local_88 = QVar35;
        dVar30 = ceil(8.0 / dVar30);
        uVar14 = (uint)dVar30;
        if (7 < (int)uVar14) {
          uVar14 = 8;
        }
        uVar20 = 1;
        if (1 < (int)uVar14) {
          uVar20 = uVar14;
        }
        info->scale_num = uVar20;
        info->scale_denom = 8;
        QVar35 = local_88;
      }
      else {
        uVar20 = (local_88.x2.m_i - local_88.x1.m_i) + 1;
        uVar25 = (int)uVar20 / RVar28.m_i;
        uVar21 = (local_88.y2.m_i - local_88.y1.m_i) + 1;
        uVar14 = (int)uVar21 / RVar24.m_i;
        if ((int)uVar25 < (int)uVar14) {
          uVar14 = uVar25;
        }
        if (uVar14 < 2) {
          info->scale_num = 1;
          info->scale_denom = 1;
        }
        else {
          uVar23 = 2;
          if (3 < uVar14) {
            uVar23 = (ulong)((uint)(7 < uVar14) * 4 + 4);
          }
          info->scale_denom = (uint)uVar23;
          info->scale_num = 1;
          do {
            uVar14 = (uint)uVar23;
            uVar25 = uVar14 - 1;
            if ((((local_88.x1.m_i & uVar25) == 0) && ((local_88.y1.m_i & uVar25) == 0)) &&
               (((uVar20 & uVar25) == 0 && ((uVar21 & uVar25) == 0)))) break;
            uVar23 = uVar23 >> 1;
            info->scale_denom = (uint)uVar23;
          } while (3 < uVar14);
        }
      }
    }
    if (uVar15 < 0x32) {
      info->dct_method = JDCT_IFAST;
      info->do_fancy_upsampling = 0;
    }
    local_88 = QVar35;
    jpeg_calc_output_dimensions(info);
    local_98.x1.m_i = 0;
    local_98.y1.m_i = 0;
    uVar1 = info->output_width;
    uVar2 = info->output_height;
    RVar32.m_i = uVar1 + -1;
    RVar33.m_i = uVar2 + -1;
    local_98._8_8_ = CONCAT44(RVar33.m_i,RVar32.m_i);
    local_a8.x1.m_i = -0x55555556;
    local_a8.y1.m_i = -0x55555556;
    local_a8.x2.m_i = -0x55555556;
    local_a8.y2.m_i = -0x55555556;
    if (local_88.y2.m_i < local_88.y1.m_i || local_88.x2.m_i < local_88.x1.m_i) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_98._8_8_;
      QVar36 = (QRect)(auVar6 << 0x40);
      local_a8.x1.m_i = 0;
      local_a8.y1.m_i = 0;
    }
    else {
      uVar15 = info->scale_denom;
      if (uVar15 == info->scale_num) {
        QVar36 = (QRect)QRect::operator&(&local_88,&local_98);
      }
      else {
        local_a8.y1.m_i = local_88.y1.m_i / (int)uVar15;
        local_a8.x1.m_i = local_88.x1.m_i / (int)uVar15;
        local_a8.y2.m_i =
             local_88.y1.m_i / (int)uVar15 + -1 +
             ((local_88.y2.m_i - local_88.y1.m_i) + 1) / (int)uVar15;
        local_a8.x2.m_i =
             local_88.x1.m_i / (int)uVar15 + -1 +
             ((local_88.x2.m_i - local_88.x1.m_i) + 1) / (int)uVar15;
        QVar36 = (QRect)QRect::operator&(&local_a8,&local_98);
      }
      RVar32 = QVar36.x2.m_i;
      RVar33 = QVar36.y2.m_i;
      local_a8.y1 = QVar36.y1.m_i;
      local_a8.x1 = QVar36.x1.m_i;
    }
    iVar12 = info->output_components;
    if (iVar12 == 1) {
      FVar22 = Format_Grayscale8;
    }
    else if (iVar12 == 4) {
      FVar22 = (uint)(info->out_color_space == JCS_CMYK) << 5 | Format_RGB32;
    }
    else {
      if (iVar12 != 3) goto LAB_001062ce;
      FVar22 = Format_RGB32;
    }
    QVar27.wd.m_i = (RVar32.m_i - local_a8.x1.m_i) + 1;
    QVar27.ht.m_i = (RVar33.m_i - local_a8.y1.m_i) + 1;
    local_a8 = QVar36;
    cVar10 = QImageIOHandler::allocateImage(QVar27,FVar22,outImage);
    QVar36 = local_a8;
    if (cVar10 != '\0') {
      AVar26 = (AspectRatioMode)outImage;
      if (info->output_components == 1) {
        if (local_a8.x1.m_i != local_98.x1.m_i) goto LAB_00106838;
        if (local_a8.x2.m_i != local_98.x2.m_i) goto LAB_00106838;
        if (local_a8.y1.m_i != local_98.y1.m_i) goto LAB_00106838;
        if (local_a8.y2.m_i != local_98.y2.m_i) goto LAB_00106838;
        jpeg_start_decompress(info);
        uVar15 = info->output_height;
        uVar14 = info->output_scanline;
        if (uVar14 < uVar15) {
          do {
            local_58 = (code *)QImage::scanLine(AVar26);
            jpeg_read_scanlines(info,&local_58,1);
            uVar15 = info->output_height;
            uVar14 = info->output_scanline;
          } while (uVar14 < uVar15);
        }
      }
      else {
LAB_00106838:
        ppJVar16 = (*info->mem->alloc_sarray)
                             ((j_common_ptr)info,1,info->output_components * info->output_width,1);
        jpeg_start_decompress(info);
        uVar15 = info->output_height;
        uVar14 = info->output_scanline;
        if (uVar14 < uVar15) {
          iVar12 = uVar14 - local_a8.y1.m_i;
          if (iVar12 < (local_a8.y2.m_i - local_a8.y1.m_i) + 1) {
            do {
              jpeg_read_scanlines(info,ppJVar16,1);
              if (-1 < iVar12) {
                if (info->output_components == 3) {
                  lVar17 = (long)local_a8.x1.m_i;
                  pJVar29 = *ppJVar16;
                  pqVar18 = (quint32 *)QImage::scanLine(AVar26);
                  (*converter)(pqVar18,pJVar29 + lVar17 * 3,(local_a8.x2.m_i - local_a8.x1.m_i) + 1)
                  ;
                }
                else if (info->out_color_space == JCS_CMYK) {
                  pJVar29 = *ppJVar16 + (local_a8.x1.m_i << 2);
                  __dest = (void *)QImage::scanLine(AVar26);
                  iVar12 = (local_a8.x2.m_i - local_a8.x1.m_i) + 1;
                  if (invertCMYK) {
                    if (0 < iVar12) {
                      lVar17 = 0;
                      do {
                        *(uint *)((long)__dest + lVar17 * 4) = ~*(uint *)(pJVar29 + lVar17 * 4);
                        lVar17 = lVar17 + 1;
                      } while ((int)lVar17 < (local_a8.x2.m_i - local_a8.x1.m_i) + 1);
                    }
                  }
                  else {
                    iVar12 = iVar12 * 4;
LAB_0010698c:
                    memcpy(__dest,pJVar29,(long)iVar12);
                  }
                }
                else if (info->output_components == 1) {
                  __dest = (void *)QImage::scanLine(AVar26);
                  pJVar29 = *ppJVar16 + local_a8.x1.m_i;
                  iVar12 = (local_a8.x2.m_i - local_a8.x1.m_i) + 1;
                  goto LAB_0010698c;
                }
              }
              uVar15 = info->output_height;
              uVar14 = info->output_scanline;
              if (uVar15 <= uVar14) break;
              iVar12 = uVar14 - local_a8.y1.m_i;
            } while (iVar12 < (local_a8.y2.m_i - local_a8.y1.m_i) + 1);
          }
        }
      }
      if (uVar14 == uVar15) {
        jpeg_finish_decompress(info);
      }
      bVar11 = info->density_unit;
      uVar15 = (uint)bVar11;
      if (bVar11 == 2) {
        QImage::setDotsPerMeterX(AVar26);
LAB_00106a68:
        uVar15 = QImage::setDotsPerMeterY(AVar26);
      }
      else if (bVar11 == 1) {
        QImage::setDotsPerMeterX(AVar26);
        goto LAB_00106a68;
      }
      if ((-1 < RVar28.m_i) && (-1 < RVar24.m_i)) {
        if (RVar28.m_i == (local_a8.x2.m_i - local_a8.x1.m_i) + 1) {
          uVar15 = (local_a8.y2.m_i - local_a8.y1.m_i) + 1;
          if (RVar24.m_i == uVar15) goto LAB_00106b2a;
        }
        QImage::scaled((QSize *)&local_c0,AVar26,(TransformationMode)&local_60);
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_58 = (code *)0xaaaaaaaaaaaaaaaa;
        uStack_50 = 0xaaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar7 = local_b0;
        local_58 = QString::fromUtf8;
        local_b0 = 0;
        local_48 = *(undefined8 *)(outImage + 0x10);
        *(undefined8 *)(outImage + 0x10) = uVar7;
        QImage::~QImage((QImage *)&local_58);
        uVar15 = QImage::~QImage((QImage *)&local_c0);
      }
LAB_00106b2a:
      auVar31._0_4_ = -(uint)(local_70.x2.m_i < local_70.x1.m_i);
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = -(uint)(local_70.y2.m_i < local_70.y1.m_i);
      auVar31._12_4_ = -(uint)(local_70.y2.m_i < local_70.y1.m_i);
      iVar12 = movmskpd(uVar15,auVar31);
      if (iVar12 == 0) {
        QImage::copy(&local_c0);
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_58 = (code *)0xaaaaaaaaaaaaaaaa;
        uStack_50 = 0xaaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar7 = local_b0;
        local_58 = QString::fromUtf8;
        local_b0 = 0;
        local_48 = *(undefined8 *)(outImage + 0x10);
        *(undefined8 *)(outImage + 0x10) = uVar7;
        QImage::~QImage((QImage *)&local_58);
        QImage::~QImage((QImage *)&local_c0);
      }
      bVar11 = QImage::isNull();
      bVar11 = bVar11 ^ 1;
      goto LAB_001062d0;
    }
  }
  else {
    my_output_message((j_common_ptr)info);
    QVar36.x2.m_i = local_a8.x2.m_i;
    QVar36.y2.m_i = local_a8.y2.m_i;
    QVar36.x1.m_i = local_a8.x1.m_i;
    QVar36.y1.m_i = local_a8.y1.m_i;
  }
LAB_001062ce:
  bVar11 = 0;
  local_a8 = QVar36;
LAB_001062d0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar11;
}

Assistant:

static bool read_jpeg_image(QImage *outImage,
                            QSize scaledSize, QRect scaledClipRect,
                            QRect clipRect, int quality,
                            Rgb888ToRgb32Converter converter,
                            j_decompress_ptr info, struct my_error_mgr* err, bool invertCMYK)
{
    if (!setjmp(err->setjmp_buffer)) {
        // -1 means default quality.
        if (quality < 0)
            quality = 75;

        // If possible, merge the scaledClipRect into either scaledSize
        // or clipRect to avoid doing a separate scaled clipping pass.
        // Best results are achieved by clipping before scaling, not after.
        if (!scaledClipRect.isEmpty()) {
            if (scaledSize.isEmpty() && clipRect.isEmpty()) {
                // No clipping or scaling before final clip.
                clipRect = scaledClipRect;
                scaledClipRect = QRect();
            } else if (scaledSize.isEmpty()) {
                // Clipping, but no scaling: combine the clip regions.
                scaledClipRect.translate(clipRect.topLeft());
                clipRect = scaledClipRect.intersected(clipRect);
                scaledClipRect = QRect();
            } else if (clipRect.isEmpty()) {
                // No clipping, but scaling: if we can map back to an
                // integer pixel boundary, then clip before scaling.
                if ((info->image_width % scaledSize.width()) == 0 &&
                        (info->image_height % scaledSize.height()) == 0) {
                    int x = scaledClipRect.x() * info->image_width /
                            scaledSize.width();
                    int y = scaledClipRect.y() * info->image_height /
                            scaledSize.height();
                    int width = (scaledClipRect.right() + 1) *
                                info->image_width / scaledSize.width() - x;
                    int height = (scaledClipRect.bottom() + 1) *
                                 info->image_height / scaledSize.height() - y;
                    clipRect = QRect(x, y, width, height);
                    scaledSize = scaledClipRect.size();
                    scaledClipRect = QRect();
                }
            } else {
                // Clipping and scaling: too difficult to figure out,
                // and not a likely use case, so do it the long way.
            }
        }

        // Determine the scale factor to pass to libjpeg for quick downscaling.
        if (!scaledSize.isEmpty() && info->image_width && info->image_height) {
            if (clipRect.isEmpty()) {
                double f = qMin(double(info->image_width) / scaledSize.width(),
                                double(info->image_height) / scaledSize.height());

                // libjpeg supports M/8 scaling with M=[1,16]. All downscaling factors
                // are a speed improvement, but upscaling during decode is slower.
                info->scale_num   = qBound(1, qCeil(8/f), 8);
                info->scale_denom = 8;
            } else {
                info->scale_denom = qMin(clipRect.width() / scaledSize.width(),
                                         clipRect.height() / scaledSize.height());

                // Only scale by powers of two when clipping so we can
                // keep the exact pixel boundaries
                if (info->scale_denom < 2)
                    info->scale_denom = 1;
                else if (info->scale_denom < 4)
                    info->scale_denom = 2;
                else if (info->scale_denom < 8)
                    info->scale_denom = 4;
                else
                    info->scale_denom = 8;
                info->scale_num = 1;

                // Correct the scale factor so that we clip accurately.
                // It is recommended that the clip rectangle be aligned
                // on an 8-pixel boundary for best performance.
                while (info->scale_denom > 1 &&
                       ((clipRect.x() % info->scale_denom) != 0 ||
                        (clipRect.y() % info->scale_denom) != 0 ||
                        (clipRect.width() % info->scale_denom) != 0 ||
                        (clipRect.height() % info->scale_denom) != 0)) {
                    info->scale_denom /= 2;
                }
            }
        }

        // If high quality not required, use fast decompression
        if ( quality < HIGH_QUALITY_THRESHOLD ) {
            info->dct_method = JDCT_IFAST;
            info->do_fancy_upsampling = FALSE;
        }

        (void) jpeg_calc_output_dimensions(info);

        // Determine the clip region to extract.
        QRect imageRect(0, 0, info->output_width, info->output_height);
        QRect clip;
        if (clipRect.isEmpty()) {
            clip = imageRect;
        } else if (info->scale_denom == info->scale_num) {
            clip = clipRect.intersected(imageRect);
        } else {
            // The scale factor was corrected above to ensure that
            // we don't miss pixels when we scale the clip rectangle.
            clip = QRect(clipRect.x() / int(info->scale_denom),
                         clipRect.y() / int(info->scale_denom),
                         clipRect.width() / int(info->scale_denom),
                         clipRect.height() / int(info->scale_denom));
            clip = clip.intersected(imageRect);
        }

        // Allocate memory for the clipped QImage.
        if (!ensureValidImage(outImage, info, clip.size()))
            return false;

        // Avoid memcpy() overhead if grayscale with no clipping.
        bool quickGray = (info->output_components == 1 &&
                          clip == imageRect);
        if (!quickGray) {
            // Ask the jpeg library to allocate a temporary row.
            // The library will automatically delete it for us later.
            // The libjpeg docs say we should do this before calling
            // jpeg_start_decompress().  We can't use "new" here
            // because we are inside the setjmp() block and an error
            // in the jpeg input stream would cause a memory leak.
            JSAMPARRAY rows = (info->mem->alloc_sarray)
                              ((j_common_ptr)info, JPOOL_IMAGE,
                               info->output_width * info->output_components, 1);

            (void) jpeg_start_decompress(info);

            while (info->output_scanline < info->output_height) {
                int y = int(info->output_scanline) - clip.y();
                if (y >= clip.height())
                    break;      // We've read the entire clip region, so abort.

                (void) jpeg_read_scanlines(info, rows, 1);

                if (y < 0)
                    continue;   // Haven't reached the starting line yet.

                if (info->output_components == 3) {
                    uchar *in = rows[0] + clip.x() * 3;
                    QRgb *out = (QRgb*)outImage->scanLine(y);
                    converter(out, in, clip.width());
                } else if (info->out_color_space == JCS_CMYK) {
                    uchar *in = rows[0] + clip.x() * 4;
                    quint32 *out = (quint32*)outImage->scanLine(y);
                    if (invertCMYK) {
                        for (int i = 0; i < clip.width(); ++i) {
                            *out++ = 0xffffffffu - (in[0] | in[1] << 8 | in[2] << 16 | in[3] << 24);
                            in += 4;
                        }
                    } else {
                        memcpy(out, in, clip.width() * 4);
                    }
                } else if (info->output_components == 1) {
                    // Grayscale.
                    memcpy(outImage->scanLine(y),
                           rows[0] + clip.x(), clip.width());
                }
            }
        } else {
            // Load unclipped grayscale data directly into the QImage.
            (void) jpeg_start_decompress(info);
            while (info->output_scanline < info->output_height) {
                uchar *row = outImage->scanLine(info->output_scanline);
                (void) jpeg_read_scanlines(info, &row, 1);
            }
        }

        if (info->output_scanline == info->output_height)
            (void) jpeg_finish_decompress(info);

        if (info->density_unit == 1) {
            outImage->setDotsPerMeterX(int(100. * info->X_density / 2.54));
            outImage->setDotsPerMeterY(int(100. * info->Y_density / 2.54));
        } else if (info->density_unit == 2) {
            outImage->setDotsPerMeterX(int(100. * info->X_density));
            outImage->setDotsPerMeterY(int(100. * info->Y_density));
        }

        if (scaledSize.isValid() && scaledSize != clip.size()) {
            *outImage = outImage->scaled(scaledSize, Qt::IgnoreAspectRatio, quality >= HIGH_QUALITY_THRESHOLD ? Qt::SmoothTransformation : Qt::FastTransformation);
        }

        if (!scaledClipRect.isEmpty())
            *outImage = outImage->copy(scaledClipRect);
        return !outImage->isNull();
    }
    else {
        my_output_message(j_common_ptr(info));
        return false;
    }
}